

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
FreeHeapBlock(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
              *this,SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  uint32 *puVar1;
  
  SmallHeapBlockT<MediumAllocationBlockAttributes>::Reset
            ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
       (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->emptyBlockList;
  this->emptyBlockList = heapBlock;
  puVar1 = &(this->super_HeapBucket).emptyHeapBlockCount;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::FreeHeapBlock(TBlockType * heapBlock)
{
    heapBlock->Reset();
    heapBlock->SetNextBlock(emptyBlockList);
    emptyBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    this->emptyHeapBlockCount++;
#endif
}